

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                 (long param_1,uint param_2,int param_3)

{
  char *message;
  uint uVar1;
  uint index;
  uint index_1;
  char *end;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_1c;
  char *local_18;
  no_thousands_sep local_9 [9];
  
  if (param_3 < 0) {
    message = (char *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure
              ((assertion_failure *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               message);
    __cxa_throw(message,&assertion_failure::typeinfo,assertion_failure::~assertion_failure);
  }
  local_1c = param_2;
  local_18 = (char *)(param_1 + param_3);
  while (99 < local_1c) {
    uVar1 = (local_1c % 100) * 2;
    local_1c = local_1c / 100;
    local_18[-1] = basic_data<void>::DIGITS[uVar1 + 1];
    no_thousands_sep::operator()(local_9,local_18 + -1);
    local_18[-2] = basic_data<void>::DIGITS[uVar1];
    no_thousands_sep::operator()(local_9,local_18 + -2);
    local_18 = local_18 + -2;
  }
  if (local_1c < 10) {
    local_18[-1] = (char)local_1c + '0';
  }
  else {
    local_1c = local_1c * 2;
    local_18[-1] = basic_data<void>::DIGITS[local_1c + 1];
    no_thousands_sep::operator()(local_9,local_18 + -1);
    local_18[-2] = basic_data<void>::DIGITS[local_1c];
  }
  return (char *)(param_1 + param_3);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}